

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O1

void IDAFree(void **ida_mem)

{
  IDAMem IDA_mem;
  
  IDA_mem = (IDAMem)*ida_mem;
  if (IDA_mem != (IDAMem)0x0) {
    IDAFreeVectors(IDA_mem);
    if (IDA_mem->ownNLS != 0) {
      SUNNonlinSolFree(IDA_mem->NLS);
      IDA_mem->ownNLS = 0;
      IDA_mem->NLS = (SUNNonlinearSolver)0x0;
    }
    if (IDA_mem->ida_lfree != (_func_int_IDAMemRec_ptr *)0x0) {
      (*IDA_mem->ida_lfree)(IDA_mem);
    }
    if (0 < IDA_mem->ida_nrtfn) {
      free(IDA_mem->ida_glo);
      IDA_mem->ida_glo = (sunrealtype *)0x0;
      free(IDA_mem->ida_ghi);
      IDA_mem->ida_ghi = (sunrealtype *)0x0;
      free(IDA_mem->ida_grout);
      IDA_mem->ida_grout = (sunrealtype *)0x0;
      free(IDA_mem->ida_iroots);
      IDA_mem->ida_iroots = (int *)0x0;
      free(IDA_mem->ida_rootdir);
      IDA_mem->ida_rootdir = (int *)0x0;
      free(IDA_mem->ida_gactive);
      IDA_mem->ida_gactive = (int *)0x0;
    }
    free(*ida_mem);
    *ida_mem = (void *)0x0;
  }
  return;
}

Assistant:

void IDAFree(void** ida_mem)
{
  IDAMem IDA_mem;

  if (*ida_mem == NULL) { return; }

  IDA_mem = (IDAMem)(*ida_mem);

  IDAFreeVectors(IDA_mem);

  /* if IDA created the NLS object then free it */
  if (IDA_mem->ownNLS)
  {
    SUNNonlinSolFree(IDA_mem->NLS);
    IDA_mem->ownNLS = SUNFALSE;
    IDA_mem->NLS    = NULL;
  }

  if (IDA_mem->ida_lfree != NULL) { IDA_mem->ida_lfree(IDA_mem); }

  if (IDA_mem->ida_nrtfn > 0)
  {
    free(IDA_mem->ida_glo);
    IDA_mem->ida_glo = NULL;
    free(IDA_mem->ida_ghi);
    IDA_mem->ida_ghi = NULL;
    free(IDA_mem->ida_grout);
    IDA_mem->ida_grout = NULL;
    free(IDA_mem->ida_iroots);
    IDA_mem->ida_iroots = NULL;
    free(IDA_mem->ida_rootdir);
    IDA_mem->ida_rootdir = NULL;
    free(IDA_mem->ida_gactive);
    IDA_mem->ida_gactive = NULL;
  }

  free(*ida_mem);
  *ida_mem = NULL;
}